

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueBase.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsTorqueBase::ArchiveOUT(ChShaftsTorqueBase *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChShaftsTorqueBase>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveOUT((ChPhysicsItem *)this,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

void ChShaftsTorqueBase::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsTorqueBase>();

    // serialize parent class
    ChShaftsCouple::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(torque);
}